

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::convertCase_pcp<axl::enc::ToUpperCase>
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this)

{
  SrcUnit *p;
  size_t length;
  C *dst;
  StringRef src;
  
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (&src,&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  p = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p;
  length = enc::
           Convert<axl::enc::Utf8,_axl::enc::Utf8,_axl::enc::ToUpperCase,_axl::enc::Utf8Decoder>::
           calcRequiredLength(p,p + (this->
                                    super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
                                    m_length,0xfffd);
  dst = createBuffer(this,length,false);
  if (dst == (C *)0x0) {
    length = 0xffffffffffffffff;
  }
  else {
    enc::Convert<axl::enc::Utf8,_axl::enc::Utf8,_axl::enc::ToUpperCase,_axl::enc::Utf8Decoder>::
    convert_u(dst,src.m_p,src.m_p + src.m_length,0xfffd);
  }
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&src);
  return length;
}

Assistant:

size_t
	convertCase_pcp() {
		StringRef src = *this; // save old contents -- can't convert in-place because length can increase

		size_t length = enc::Convert<Encoding, Encoding, CaseOp>::calcRequiredLength(this->m_p, this->m_p + this->m_length);
		C* p = createBuffer(length);
		if (!p)
			return -1;

		enc::Convert<Encoding, Encoding, CaseOp>::convert_u(p, src.cp(), src.getEnd());
		return length;
	}